

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void deflate(nghttp2_hd_deflater *deflater,nghttp2_hd_inflater *inflater,nghttp2_nv *nva,
            size_t nvlen)

{
  size_t sVar1;
  nghttp2_hd_deflater *pnVar2;
  nghttp2_nv *pnVar3;
  size_t *psVar4;
  size_t __size;
  void *__ptr;
  ulong uVar5;
  size_t sVar6;
  char *__format;
  FILE *__stream;
  long lVar7;
  ulong uVar8;
  void *pvVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  uint local_7c;
  size_t local_78;
  nghttp2_hd_inflater *local_70;
  nghttp2_hd_deflater *local_68;
  nghttp2_nv *local_60;
  nghttp2_nv nv;
  
  psVar4 = &nva->valuelen;
  lVar7 = 0;
  sVar6 = nvlen;
  while (bVar10 = sVar6 != 0, sVar6 = sVar6 - 1, bVar10) {
    lVar7 = lVar7 + psVar4[-1] + *psVar4;
    psVar4 = psVar4 + 5;
  }
  local_78 = nvlen;
  local_70 = inflater;
  local_68 = deflater;
  printf("Input (%zu byte(s)):\n\n",lVar7);
  psVar4 = &nva->valuelen;
  sVar6 = local_78;
  local_60 = nva;
  while (pnVar3 = local_60, pnVar2 = local_68, sVar1 = local_78, bVar10 = sVar6 != 0,
        sVar6 = sVar6 - 1, bVar10) {
    fwrite(((nghttp2_nv *)(psVar4 + -3))->name,1,psVar4[-1],_stdout);
    printf(": ");
    fwrite((uint8_t *)psVar4[-2],1,*psVar4,_stdout);
    putchar(10);
    psVar4 = psVar4 + 5;
  }
  __size = nghttp2_hd_deflate_bound(local_68,local_60,local_78);
  __ptr = malloc(__size);
  uVar5 = nghttp2_hd_deflate_hd2(pnVar2,__ptr,__size,pnVar3,sVar1);
  __stream = _stderr;
  if ((long)uVar5 < 0) {
    lVar7 = nghttp2_strerror(uVar5 & 0xffffffff);
    __format = "nghttp2_hd_deflate_hd2() failed with error: %s\n";
  }
  else {
    dVar11 = 0.0;
    if (lVar7 != 0) {
      auVar12._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = 0x45300000;
      dVar11 = (double)(long)uVar5 /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
    }
    printf("\nDeflate (%zu byte(s), ratio %.02f):\n\n",dVar11,uVar5);
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      if ((uVar8 & 0xf) == 0) {
        printf("%08zX: ",uVar8);
      }
      printf("%02X ",(ulong)*(byte *)((long)__ptr + uVar8));
      if (((int)uVar8 + 1U & 0xf) == 0) {
        putchar(10);
      }
    }
    puts("\n\nInflate:\n");
    pvVar9 = __ptr;
    while( true ) {
      local_7c = 0;
      lVar7 = nghttp2_hd_inflate_hd3(local_70,&nv,&local_7c,pvVar9,uVar5,1);
      if (lVar7 < 0) break;
      if ((local_7c & 2) != 0) {
        fwrite(nv.name,1,nv.namelen,_stderr);
        fwrite(": ",2,1,_stderr);
        fwrite(nv.value,1,nv.valuelen,_stderr);
        fputc(10,_stderr);
      }
      if ((local_7c & 1) != 0) {
        nghttp2_hd_inflate_end_headers(local_70);
LAB_001015e5:
        puts("\n-------------------------------------------------------------------------------");
        free(__ptr);
        return;
      }
      uVar5 = uVar5 - lVar7;
      if (uVar5 == 0 && (local_7c & 2) == 0) goto LAB_001015e5;
      pvVar9 = (void *)((long)pvVar9 + lVar7);
    }
    __format = "inflate failed with error code %td";
    __stream = _stderr;
  }
  fprintf(__stream,__format,lVar7);
  free(__ptr);
  exit(1);
}

Assistant:

static void deflate(nghttp2_hd_deflater *deflater,
                    nghttp2_hd_inflater *inflater, const nghttp2_nv *const nva,
                    size_t nvlen) {
  nghttp2_ssize rv;
  uint8_t *buf;
  size_t buflen;
  size_t outlen;
  size_t i;
  size_t sum;

  sum = 0;

  for (i = 0; i < nvlen; ++i) {
    sum += nva[i].namelen + nva[i].valuelen;
  }

  printf("Input (%zu byte(s)):\n\n", sum);

  for (i = 0; i < nvlen; ++i) {
    fwrite(nva[i].name, 1, nva[i].namelen, stdout);
    printf(": ");
    fwrite(nva[i].value, 1, nva[i].valuelen, stdout);
    printf("\n");
  }

  buflen = nghttp2_hd_deflate_bound(deflater, nva, nvlen);
  buf = malloc(buflen);

  rv = nghttp2_hd_deflate_hd2(deflater, buf, buflen, nva, nvlen);

  if (rv < 0) {
    fprintf(stderr, "nghttp2_hd_deflate_hd2() failed with error: %s\n",
            nghttp2_strerror((int)rv));

    free(buf);

    exit(EXIT_FAILURE);
  }

  outlen = (size_t)rv;

  printf("\nDeflate (%zu byte(s), ratio %.02f):\n\n", outlen,
         sum == 0 ? 0 : (double)outlen / (double)sum);

  for (i = 0; i < outlen; ++i) {
    if ((i & 0x0fu) == 0) {
      printf("%08zX: ", i);
    }

    printf("%02X ", buf[i]);

    if (((i + 1) & 0x0fu) == 0) {
      printf("\n");
    }
  }

  printf("\n\nInflate:\n\n");

  /* We pass 1 to final parameter, because buf contains whole deflated
     header data. */
  rv = inflate_header_block(inflater, buf, outlen, 1);

  if (rv != 0) {
    free(buf);

    exit(EXIT_FAILURE);
  }

  printf("\n-----------------------------------------------------------"
         "--------------------\n");

  free(buf);
}